

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_bind_state.cpp
# Opt level: O2

void __thiscall duckdb::SelectBindState::AddExpandedColumn(SelectBindState *this,idx_t expand_count)

{
  vector<unsigned_long,_true> *this_00;
  unsigned_long in_RAX;
  reference pvVar1;
  unsigned_long local_18;
  
  this_00 = &this->expanded_column_indices;
  local_18 = in_RAX;
  if ((this->expanded_column_indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->expanded_column_indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_18 = 0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_18);
  }
  pvVar1 = vector<unsigned_long,_true>::back(this_00);
  local_18 = expand_count + *pvVar1;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_18);
  return;
}

Assistant:

void SelectBindState::AddExpandedColumn(idx_t expand_count) {
	if (expanded_column_indices.empty()) {
		expanded_column_indices.push_back(0);
	}
	expanded_column_indices.push_back(expanded_column_indices.back() + expand_count);
}